

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng::save_file(vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,
                       string *filename)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  char *pcVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  ofstream file;
  const_reference local_240;
  undefined7 in_stack_fffffffffffffdd0;
  long local_218 [65];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_10;
  uint local_4;
  
  local_10 = in_RDI;
  pcVar4 = (char *)std::__cxx11::string::c_str();
  _Var3 = std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream(local_218,pcVar4,_Var3);
  bVar1 = std::ios::operator!((ios *)((long)local_218 + *(long *)(local_218[0] + -0x18)));
  if ((bVar1 & 1) == 0) {
    bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(bVar1,in_stack_fffffffffffffdd0));
    if (bVar2) {
      local_240 = (const_reference)0x0;
    }
    else {
      local_240 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_10,0)
      ;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_10);
    std::ostream::write((char *)local_218,(long)local_240);
    local_4 = 0;
  }
  else {
    local_4 = 0x4f;
  }
  std::ofstream::~ofstream(local_218);
  return local_4;
}

Assistant:

unsigned save_file(const std::vector<unsigned char>& buffer, const std::string& filename)
{
  std::ofstream file(filename.c_str(), std::ios::out|std::ios::binary);
  if(!file) return 79;
  file.write(buffer.empty() ? 0 : (char*)&buffer[0], std::streamsize(buffer.size()));
  return 0;
}